

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O0

Abc_Obj_t * Abc_ConvertAigToAig(Abc_Ntk_t *pNtkAig,Abc_Obj_t *pObjOld)

{
  Hop_Man_t *p;
  Hop_Obj_t *p_00;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar1;
  int iVar2;
  Hop_Obj_t *pHVar3;
  Abc_Obj_t *pAVar4;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 *paVar5;
  int local_3c;
  int i;
  Abc_Obj_t *pFanin;
  Hop_Obj_t *pRoot;
  Hop_Man_t *pHopMan;
  Abc_Obj_t *pObjOld_local;
  Abc_Ntk_t *pNtkAig_local;
  
  p = (Hop_Man_t *)pObjOld->pNtk->pManFunc;
  p_00 = *(Hop_Obj_t **)&(pObjOld->field_5).iData;
  pHVar3 = Hop_Regular(p_00);
  iVar2 = Hop_ObjIsConst1(pHVar3);
  if (iVar2 == 0) {
    for (local_3c = 0; iVar2 = Abc_ObjFaninNum(pObjOld), local_3c < iVar2; local_3c = local_3c + 1)
    {
      pAVar4 = Abc_ObjFanin(pObjOld,local_3c);
      if ((pAVar4->field_6).pTemp == (void *)0x0) {
        __assert_fail("pFanin->pCopy != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFunc.c"
                      ,0x442,"Abc_Obj_t *Abc_ConvertAigToAig(Abc_Ntk_t *, Abc_Obj_t *)");
      }
      aVar1 = pAVar4->field_6;
      paVar5 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17 *)Hop_ManPi(p,local_3c);
      *paVar5 = aVar1;
    }
    pHVar3 = Hop_Regular(p_00);
    Abc_ConvertAigToAig_rec(pNtkAig,pHVar3);
    pHVar3 = Hop_Regular(p_00);
    Hop_ConeUnmark_rec(pHVar3);
    pHVar3 = Hop_Regular(p_00);
    pAVar4 = (Abc_Obj_t *)(pHVar3->field_0).pData;
    iVar2 = Hop_IsComplement(p_00);
    pNtkAig_local = (Abc_Ntk_t *)Abc_ObjNotCond(pAVar4,iVar2);
  }
  else {
    pAVar4 = Abc_AigConst1(pNtkAig);
    iVar2 = Hop_IsComplement(p_00);
    pNtkAig_local = (Abc_Ntk_t *)Abc_ObjNotCond(pAVar4,iVar2);
  }
  return (Abc_Obj_t *)pNtkAig_local;
}

Assistant:

Abc_Obj_t * Abc_ConvertAigToAig( Abc_Ntk_t * pNtkAig, Abc_Obj_t * pObjOld )
{
    Hop_Man_t * pHopMan;
    Hop_Obj_t * pRoot;
    Abc_Obj_t * pFanin;
    int i;
    // get the local AIG
    pHopMan = (Hop_Man_t *)pObjOld->pNtk->pManFunc;
    pRoot = (Hop_Obj_t *)pObjOld->pData;
    // check the case of a constant
    if ( Hop_ObjIsConst1( Hop_Regular(pRoot) ) )
        return Abc_ObjNotCond( Abc_AigConst1(pNtkAig), Hop_IsComplement(pRoot) );
    // assign the fanin nodes
    Abc_ObjForEachFanin( pObjOld, pFanin, i )
    {
        assert( pFanin->pCopy != NULL );
        Hop_ManPi(pHopMan, i)->pData = pFanin->pCopy;
    }
    // construct the AIG
    Abc_ConvertAigToAig_rec( pNtkAig, Hop_Regular(pRoot) );
    Hop_ConeUnmark_rec( Hop_Regular(pRoot) );
    // return the result
    return Abc_ObjNotCond( (Abc_Obj_t *)Hop_Regular(pRoot)->pData, Hop_IsComplement(pRoot) );  
}